

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

int bsdunzip_getopt(bsdunzip *bsdunzip)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  bsdunzip_option *pbVar6;
  size_t __n;
  uint __c;
  
  while( true ) {
    bsdunzip->argument = (char *)0x0;
    if (bsdunzip->getopt_state == 0) {
      ppcVar1 = bsdunzip->argv;
      bsdunzip->argv = ppcVar1 + 1;
      bsdunzip->argc = bsdunzip->argc + -1;
      if (ppcVar1[1] == (char *)0x0) {
        return -1;
      }
      bsdunzip->getopt_state = 1;
    }
    if (bsdunzip->getopt_state == 1) {
      ppcVar1 = bsdunzip->argv;
      pcVar3 = *ppcVar1;
      if (pcVar3 == (char *)0x0) {
        return -1;
      }
      if (*pcVar3 != '-') {
        return -1;
      }
      iVar2 = strcmp(pcVar3,"--");
      bsdunzip->argv = ppcVar1 + 1;
      if (iVar2 == 0) {
        bsdunzip->argc = bsdunzip->argc + -1;
        bsdunzip_optind = bsdunzip_optind + 1;
        return -1;
      }
      pcVar3 = *ppcVar1;
      bsdunzip->getopt_word = pcVar3;
      bsdunzip->argc = bsdunzip->argc + -1;
      bsdunzip_optind = bsdunzip_optind + 1;
      if (pcVar3[1] == '-') {
        bsdunzip->getopt_state = 3;
        pcVar3 = pcVar3 + 2;
      }
      else {
        pcVar3 = pcVar3 + 1;
        bsdunzip->getopt_state = 2;
      }
      bsdunzip->getopt_word = pcVar3;
    }
    if (bsdunzip->getopt_state != 2) {
      __c = 0;
      goto LAB_00105596;
    }
    pcVar3 = bsdunzip->getopt_word;
    bsdunzip->getopt_word = pcVar3 + 1;
    __c = (uint)*pcVar3;
    if (__c != 0) break;
    bsdunzip->getopt_state = 1;
  }
  pvVar4 = memchr("aCcd:fI:jLlnO:opP:qtuvx:yZ:",__c,0x1c);
  if (pvVar4 == (void *)0x0) {
    return 0x3f;
  }
  if (*(char *)((long)pvVar4 + 1) == ':') {
    if (pcVar3[1] == '\0') {
      pcVar3 = *bsdunzip->argv;
      bsdunzip->getopt_word = pcVar3;
      if (pcVar3 == (char *)0x0) {
        lafe_warnc(0,"Option -%c requires an argument",(ulong)__c);
        return 0x3f;
      }
      bsdunzip->argv = bsdunzip->argv + 1;
      bsdunzip->argc = bsdunzip->argc + -1;
      bsdunzip_optind = bsdunzip_optind + 1;
    }
    bsdunzip->getopt_state = 1;
    bsdunzip->argument = bsdunzip->getopt_word;
  }
LAB_00105596:
  if (bsdunzip->getopt_state != 3) {
    return __c;
  }
  bsdunzip->getopt_state = 1;
  pcVar3 = bsdunzip->getopt_word;
  pcVar5 = strchr(pcVar3,0x3d);
  if (pcVar5 == (char *)0x0) {
    __n = strlen(pcVar3);
  }
  else {
    __n = (long)pcVar5 - (long)pcVar3;
    bsdunzip->argument = pcVar5 + 1;
  }
  if (*pcVar3 == 'v') {
    iVar2 = strncmp(pcVar3,"version",__n);
    pbVar6 = (bsdunzip_option *)0x0;
    if (iVar2 == 0) {
      pbVar6 = bsdunzip_longopts;
    }
  }
  else {
    pbVar6 = (bsdunzip_option *)0x0;
  }
  if (pbVar6 == (bsdunzip_option *)0x0) {
    pcVar5 = "Option %s%s is not supported";
LAB_00105673:
    lafe_warnc(0,pcVar5,"--",pcVar3);
    iVar2 = 0x3f;
  }
  else {
    pcVar3 = bsdunzip->argument;
    if (pbVar6->required == 0) {
      if (pcVar3 != (char *)0x0) {
        pcVar3 = pbVar6->name;
        pcVar5 = "Option %s%s does not allow an argument";
        goto LAB_00105673;
      }
    }
    else if (pcVar3 == (char *)0x0) {
      pcVar3 = *bsdunzip->argv;
      bsdunzip->argument = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = pbVar6->name;
        pcVar5 = "Option %s%s requires an argument";
        goto LAB_00105673;
      }
      bsdunzip->argv = bsdunzip->argv + 1;
      bsdunzip->argc = bsdunzip->argc + -1;
      bsdunzip_optind = bsdunzip_optind + 1;
    }
    iVar2 = pbVar6->equivalent;
  }
  return iVar2;
}

Assistant:

int
bsdunzip_getopt(struct bsdunzip *bsdunzip)
{
	enum { state_start = 0, state_next_word, state_short, state_long };

	const struct bsdunzip_option *popt, *match, *match2;
	const char *p, *long_prefix;
	size_t optlength;
	int opt;
	int required;

again:
	match = NULL;
	match2 = NULL;
	long_prefix = "--";
	opt = OPTION_NONE;
	required = 0;
	bsdunzip->argument = NULL;

	/* First time through, initialize everything. */
	if (bsdunzip->getopt_state == state_start) {
		/* Skip program name. */
		++bsdunzip->argv;
		--bsdunzip->argc;
		if (*bsdunzip->argv == NULL)
			return (-1);
		bsdunzip->getopt_state = state_next_word;
	}

	/*
	 * We're ready to look at the next word in argv.
	 */
	if (bsdunzip->getopt_state == state_next_word) {
		/* No more arguments, so no more options. */
		if (bsdunzip->argv[0] == NULL)
			return (-1);
		/* Doesn't start with '-', so no more options. */
		if (bsdunzip->argv[0][0] != '-')
			return (-1);
		/* "--" marks end of options; consume it and return. */
		if (strcmp(bsdunzip->argv[0], "--") == 0) {
			++bsdunzip->argv;
			--bsdunzip->argc;
			bsdunzip_optind++;
			return (-1);
		}
		/* Get next word for parsing. */
		bsdunzip->getopt_word = *bsdunzip->argv++;
		--bsdunzip->argc;
		bsdunzip_optind++;
		if (bsdunzip->getopt_word[1] == '-') {
			/* Set up long option parser. */
			bsdunzip->getopt_state = state_long;
			bsdunzip->getopt_word += 2; /* Skip leading '--' */
		} else {
			/* Set up short option parser. */
			bsdunzip->getopt_state = state_short;
			++bsdunzip->getopt_word;  /* Skip leading '-' */
		}
	}

	/*
	 * We're parsing a group of POSIX-style single-character options.
	 */
	if (bsdunzip->getopt_state == state_short) {
		/* Peel next option off of a group of short options. */
		opt = *bsdunzip->getopt_word++;
		if (opt == '\0') {
			/* End of this group; recurse to get next option. */
			bsdunzip->getopt_state = state_next_word;
			goto again;
		}

		/* Does this option take an argument? */
		p = strchr(short_options, opt);
		if (p == NULL)
			return ('?');
		if (p[1] == ':')
			required = 1;

		/* If it takes an argument, parse that. */
		if (required) {
			/* If arg is run-in, bsdunzip->getopt_word already points to it. */
			if (bsdunzip->getopt_word[0] == '\0') {
				/* Otherwise, pick up the next word. */
				bsdunzip->getopt_word = *bsdunzip->argv;
				if (bsdunzip->getopt_word == NULL) {
					lafe_warnc(0,
					    "Option -%c requires an argument",
					    opt);
					return ('?');
				}
				++bsdunzip->argv;
				--bsdunzip->argc;
				bsdunzip_optind++;
			}
			bsdunzip->getopt_state = state_next_word;
			bsdunzip->argument = bsdunzip->getopt_word;
		}
	}

	/* We're reading a long option */
	if (bsdunzip->getopt_state == state_long) {
		/* After this long option, we'll be starting a new word. */
		bsdunzip->getopt_state = state_next_word;

		/* Option name ends at '=' if there is one. */
		p = strchr(bsdunzip->getopt_word, '=');
		if (p != NULL) {
			optlength = (size_t)(p - bsdunzip->getopt_word);
			bsdunzip->argument = (char *)(uintptr_t)(p + 1);
		} else {
			optlength = strlen(bsdunzip->getopt_word);
		}

		/* Search the table for an unambiguous match. */
		for (popt = bsdunzip_longopts; popt->name != NULL; popt++) {
			/* Short-circuit if first chars don't match. */
			if (popt->name[0] != bsdunzip->getopt_word[0])
				continue;
			/* If option is a prefix of name in table, record it.*/
			if (strncmp(bsdunzip->getopt_word, popt->name, optlength) == 0) {
				match2 = match; /* Record up to two matches. */
				match = popt;
				/* If it's an exact match, we're done. */
				if (strlen(popt->name) == optlength) {
					match2 = NULL; /* Forget the others. */
					break;
				}
			}
		}

		/* Fail if there wasn't a unique match. */
		if (match == NULL) {
			lafe_warnc(0,
			    "Option %s%s is not supported",
			    long_prefix, bsdunzip->getopt_word);
			return ('?');
		}
		if (match2 != NULL) {
			lafe_warnc(0,
			    "Ambiguous option %s%s (matches --%s and --%s)",
			    long_prefix, bsdunzip->getopt_word, match->name, match2->name);
			return ('?');
		}

		/* We've found a unique match; does it need an argument? */
		if (match->required) {
			/* Argument required: get next word if necessary. */
			if (bsdunzip->argument == NULL) {
				bsdunzip->argument = *bsdunzip->argv;
				if (bsdunzip->argument == NULL) {
					lafe_warnc(0,
					    "Option %s%s requires an argument",
					    long_prefix, match->name);
					return ('?');
				}
				++bsdunzip->argv;
				--bsdunzip->argc;
				bsdunzip_optind++;
			}
		} else {
			/* Argument forbidden: fail if there is one. */
			if (bsdunzip->argument != NULL) {
				lafe_warnc(0,
				    "Option %s%s does not allow an argument",
				    long_prefix, match->name);
				return ('?');
			}
		}
		return (match->equivalent);
	}

	return (opt);
}